

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::DeepScanLineInputFile::Data::Data(Data *this,int numThreads)

{
  _Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  *this_00;
  size_t i;
  LineBuffer **__first;
  ulong uVar1;
  LineBuffer **ppLVar2;
  allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*> *extraout_RDX;
  size_t __n;
  size_t extraout_RDX_00;
  size_type __len;
  unsigned_long __n_00;
  V2f local_38;
  
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_38,1.0,INCREASING_Y,ZIP_COMPRESSION);
  DeepFrameBuffer::DeepFrameBuffer(&this->frameBuffer);
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->partNumber = -1;
  this->numThreads = numThreads;
  this->multiPartBackwardSupport = false;
  this->multiPartFile = (MultiPartInputFile *)0x0;
  this->memoryMapped = false;
  this->bigFile = false;
  this->frameBufferValid = false;
  (this->sampleCountTableBuffer)._size = 0;
  (this->sampleCountTableBuffer)._data = (char *)0x0;
  this->_streamData = (InputStreamMutex *)0x0;
  __n_00 = 1;
  if (1 < numThreads * 2) {
    __n_00 = (unsigned_long)(uint)(numThreads * 2);
  }
  this->_deleteStream = false;
  (this->lineSampleCount)._data = (uint *)0x0;
  (this->gotSampleCount)._size = 0;
  (this->sampleCount)._data = (uint *)0x0;
  (this->lineSampleCount)._size = 0;
  (this->sampleCount)._sizeX = 0;
  (this->sampleCount)._sizeY = 0;
  (this->gotSampleCount)._data = (bool *)0x0;
  __first = (LineBuffer **)operator_new(__n_00 * 8);
  std::
  __uninitialized_default_n_a<Imf_3_2::(anonymous_namespace)::LineBuffer**,unsigned_long,Imf_3_2::(anonymous_namespace)::LineBuffer*>
            (__first,__n_00,extraout_RDX);
  this_00 = (_Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
             *)(this->lineBuffers).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->lineBuffers).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)this_00;
  if (0 < (long)__n) {
    memmove(__first,this_00,__n);
    __n = extraout_RDX_00;
  }
  std::
  _Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ::_M_deallocate(this_00,(pointer)((long)(this->lineBuffers).
                                          super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_00 >> 3),__n);
  (this->lineBuffers).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = __first;
  ppLVar2 = __first + __n_00;
  (this->lineBuffers).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppLVar2;
  (this->lineBuffers).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppLVar2;
  for (uVar1 = 0; uVar1 < (ulong)((long)ppLVar2 - (long)__first >> 3); uVar1 = uVar1 + 1) {
    __first[uVar1] = (LineBuffer *)0x0;
    __first = (this->lineBuffers).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->lineBuffers).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  this->sampleCountTableComp = (Compressor *)0x0;
  return;
}

Assistant:

DeepScanLineInputFile::Data::Data (int numThreads)
    : partNumber (-1)
    , numThreads (numThreads)
    , multiPartBackwardSupport (false)
    , multiPartFile (NULL)
    , memoryMapped (false)
    , bigFile (false)
    , frameBufferValid (false)
    , _streamData (NULL)
    , _deleteStream (false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers
    //

    lineBuffers.resize (max (1, 2 * numThreads));

    for (size_t i = 0; i < lineBuffers.size (); i++)
        lineBuffers[i] = 0;

    sampleCountTableComp = 0;
}